

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexImageCubeAlignCase::createTexture(TexImageCubeAlignCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  uint rowPitch;
  int level;
  uint width;
  long lVar6;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_58;
  
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  if (0 < (this->super_TextureCubeSpecCase).m_numLevels) {
    this_01 = &(this->super_TextureCubeSpecCase).m_texFormat;
    level = 0;
    do {
      width = (this->super_TextureCubeSpecCase).m_size >> ((byte)level & 0x1f);
      if ((int)width < 2) {
        width = 1;
      }
      iVar5 = tcu::TextureFormat::getPixelSize(this_01);
      fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[0];
      fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[1];
      fVar3 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[2];
      fVar4 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[3];
      rowPitch = (iVar5 * width + this->m_alignment) - 1 & -this->m_alignment;
      colorA.m_data[0] =
           ((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1) * 1.0 +
           fVar1;
      colorA.m_data[1] =
           ((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2) * 0.0 +
           fVar2;
      colorA.m_data[2] =
           ((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3) * 0.0 +
           fVar3;
      colorA.m_data[3] =
           ((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4) * 1.0 +
           fVar4;
      fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[0];
      fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[1];
      fVar3 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[2];
      fVar4 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[3];
      colorB.m_data[0] =
           ((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1) * 0.0 +
           fVar1;
      colorB.m_data[1] =
           ((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2) * 1.0 +
           fVar2;
      colorB.m_data[2] =
           ((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3) * 0.0 +
           fVar3;
      colorB.m_data[3] =
           ((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4) * 1.0 +
           fVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data,(long)(int)(rowPitch * width));
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_58,this_01,width,width,1,rowPitch,0,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      tcu::fillWithGrid(&local_58,(width >> 2) + (uint)(width >> 2 == 0),&colorA,&colorB);
      lVar6 = 0;
      do {
        sglr::ContextWrapper::glTexImage2D
                  (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar6),level,this->m_internalFormat
                   ,width,width,0,this->m_format,this->m_dataType,
                   data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x18);
      level = level + 1;
    } while (level < (this->super_TextureCubeSpecCase).m_numLevels);
  }
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelSize	= de::max(1, m_size >> ndx);
			int		rowPitch	= deAlign32(m_texFormat.getPixelSize()*levelSize, m_alignment);
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			int		cellSize	= de::max(1, levelSize >> 2);

			data.resize(rowPitch*levelSize);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, levelSize, levelSize, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, &data[0]);
		}
	}